

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O2

void If_CutTraverse(If_Man_t *p,If_Obj_t *pRoot,If_Cut_t *pCut,Vec_Ptr_t *vNodes)

{
  If_Obj_t *Entry;
  void *pvVar1;
  int i;
  ulong uVar2;
  
  vNodes->nSize = 0;
  for (uVar2 = 0; uVar2 < (byte)pCut->field_0x1f; uVar2 = uVar2 + 1) {
    Entry = If_ManObj(p,(int)(&pCut[1].Area)[uVar2]);
    if (Entry == (If_Obj_t *)0x0) break;
    Vec_PtrPush(vNodes,Entry);
    if ((*(uint *)Entry >> 8 & 1) != 0) {
      __assert_fail("pLeaf->fMark == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifUtil.c"
                    ,0x23e,"void If_CutTraverse(If_Man_t *, If_Obj_t *, If_Cut_t *, Vec_Ptr_t *)");
    }
    *(uint *)Entry = *(uint *)Entry | 0x100;
  }
  If_CutTraverse_rec(pRoot,vNodes);
  for (i = 0; i < vNodes->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(vNodes,i);
    *(byte *)((long)pvVar1 + 1) = *(byte *)((long)pvVar1 + 1) & 0xfe;
  }
  return;
}

Assistant:

void If_CutTraverse( If_Man_t * p, If_Obj_t * pRoot, If_Cut_t * pCut, Vec_Ptr_t * vNodes )
{
    If_Obj_t * pLeaf;
    int i;
    // collect the internal nodes of the cut
    Vec_PtrClear( vNodes );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        Vec_PtrPush( vNodes, pLeaf );
        assert( pLeaf->fMark == 0 );
        pLeaf->fMark = 1;
    }
    // collect other nodes
    If_CutTraverse_rec( pRoot, vNodes );
    // clean the mark
    Vec_PtrForEachEntry( If_Obj_t *, vNodes, pLeaf, i )
        pLeaf->fMark = 0;
}